

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::
boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
::increment(boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *this)

{
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  mapping_type *pmVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pbVar9;
  uint *puVar10;
  pointer pbVar11;
  ulong uVar12;
  pointer pbVar13;
  
  peVar2 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4;
  uVar12 = this->current_;
  puVar10 = (uint *)(this->current_ * 0x10 + lVar3 + 0x18);
  do {
    uVar8 = uVar12;
    if (uVar7 <= uVar8) {
      pmVar4 = this->map_;
      peVar2 = (pmVar4->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar3 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      pbVar11 = (peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (long)pbVar11 - lVar3 >> 4;
      pbVar11 = pbVar11 + -1;
      pbVar13 = (pointer)(lVar3 + uVar8 * 0x10);
      if (uVar12 == uVar8) {
        pbVar13 = pbVar11;
      }
      pbVar9 = (pointer)(this->current_ * 0x10 + lVar3);
      if (uVar12 == this->current_) {
        pbVar9 = pbVar11;
      }
      sVar5 = pbVar13->offset;
      sVar6 = pbVar9->offset;
      this->current_ = uVar8;
      (this->value_).iterator_._M_current = (this->value_).iterator_._M_current + (sVar5 - sVar6);
      peVar2 = (pmVar4->index_).
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar3 = (long)(peVar2->
                    super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      if ((long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4 != uVar8) {
        (this->value_).rule_ = *(rule_type *)(lVar3 + 8 + uVar8 * 0x10);
      }
      return;
    }
    if (uVar7 <= uVar8 + 2) break;
    uVar1 = *puVar10;
    uVar12 = uVar8 + 1;
    puVar10 = puVar10 + 4;
  } while ((uVar1 & this->mask_) == 0);
  update_current(this,uVar8 + 1);
  return;
}

Assistant:

void increment()
                    {
                        size_t next = current_;
                        while(next < size()) {
                            next++;
                            if(valid_offset(next))
                                break;
                        }
                        update_current(next);
                    }